

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionInfo::AssertionInfo
          (AssertionInfo *this,string *_macroName,SourceLineInfo *_lineInfo,
          string *_capturedExpression,Flags _resultDisposition)

{
  string *in_RCX;
  string *in_RSI;
  SourceLineInfo *in_RDI;
  undefined4 in_R8D;
  SourceLineInfo *in_stack_ffffffffffffffa8;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  SourceLineInfo::SourceLineInfo(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::string((string *)&in_RDI[1].line,in_RCX);
  *(undefined4 *)&in_RDI[2].field_0x18 = in_R8D;
  return;
}

Assistant:

AssertionInfo::AssertionInfo(   std::string const& _macroName,
                                    SourceLineInfo const& _lineInfo,
                                    std::string const& _capturedExpression,
                                    ResultDisposition::Flags _resultDisposition )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        capturedExpression( _capturedExpression ),
        resultDisposition( _resultDisposition )
    {}